

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varchar_data.hpp
# Opt level: O2

void duckdb::ArrowVarcharData<duckdb::string_t,_duckdb::ArrowVarcharConverter,_long>::Finalize
               (ArrowAppendData *append_data,LogicalType *type,ArrowArray *result)

{
  ArrowBuffer *pAVar1;
  
  result->n_buffers = 3;
  pAVar1 = ArrowAppendData::GetMainBuffer(append_data);
  result->buffers[1] = pAVar1->dataptr;
  pAVar1 = ArrowAppendData::GetAuxBuffer(append_data);
  result->buffers[2] = pAVar1->dataptr;
  return;
}

Assistant:

static void Finalize(ArrowAppendData &append_data, const LogicalType &type, ArrowArray *result) {
		result->n_buffers = 3;
		result->buffers[1] = append_data.GetMainBuffer().data();
		result->buffers[2] = append_data.GetAuxBuffer().data();
	}